

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O3

void glob_exit(void *dummy,t_float status)

{
  sys_exit();
  sys_close_audio();
  sys_close_midi();
  if ((pd_maininstance.pd_inter)->i_havegui != 0) {
    socket_close((pd_maininstance.pd_inter)->i_guisock);
    sys_rmpollfn((pd_maininstance.pd_inter)->i_guisock);
  }
  exit((int)status);
}

Assistant:

void glob_exit(void *dummy, t_float status)
{
        /* sys_exit() sets the sys_quit flag, so all loops end */
    sys_exit();
    sys_close_audio();
    sys_close_midi();
    if (sys_havegui())
    {
        sys_closesocket(INTER->i_guisock);
        sys_rmpollfn(INTER->i_guisock);
    }
    exit((int)status);
}